

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<std::array<float,2ul>>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,array<float,_2UL> *v)

{
  bool bVar1;
  value_type *pvVar2;
  optional<std::array<float,_2UL>_> local_6c;
  undefined1 local_60 [8];
  optional<std::array<float,_2UL>_> pv_1;
  undefined1 local_44 [8];
  optional<std::array<float,_2UL>_> pv;
  array<float,_2UL> *v_local;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  PrimVar *this_local;
  
  if (v == (array<float,_2UL> *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_002f6c68;
  }
  tinyusdz::value::TimeCode::TimeCode((TimeCode *)&pv.contained,t);
  bVar1 = tinyusdz::value::TimeCode::is_default((TimeCode *)&pv.contained);
  if (bVar1) {
    get_default_value<std::array<float,2ul>>
              ((optional<std::array<float,_2UL>_> *)((long)&pv_1.contained + 4),this);
    nonstd::optional_lite::optional<std::array<float,_2UL>_>::optional<std::array<float,_2UL>,_0>
              ((optional<std::array<float,_2UL>_> *)local_44,
               (optional<std::array<float,_2UL>_> *)((long)&pv_1.contained + 4));
    nonstd::optional_lite::optional<std::array<float,_2UL>_>::~optional
              ((optional<std::array<float,_2UL>_> *)((long)&pv_1.contained + 4));
    pv_1.contained._0_1_ =
         nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_44);
    if ((bool)pv_1.contained._0_1_) {
      pvVar2 = nonstd::optional_lite::optional<std::array<float,_2UL>_>::value
                         ((optional<std::array<float,_2UL>_> *)local_44);
      *(undefined8 *)v->_M_elems = *(undefined8 *)pvVar2->_M_elems;
      this_local._7_1_ = 1;
    }
    pv_1.contained._1_3_ = 0;
    nonstd::optional_lite::optional<std::array<float,_2UL>_>::~optional
              ((optional<std::array<float,_2UL>_> *)local_44);
    if (pv_1.contained.data.__align != (anon_struct_4_0_00000001_for___align)0x0) goto LAB_002f6c68;
    bVar1 = tinyusdz::value::TimeSamples::empty(&this->_ts);
    if (bVar1) {
      this_local._7_1_ = 0;
      goto LAB_002f6c68;
    }
  }
  bVar1 = has_timesamples(this);
  if (bVar1) {
    this_local._7_1_ =
         tinyusdz::value::TimeSamples::get<std::array<float,_2UL>,_nullptr>(&this->_ts,v,t,tinterp);
  }
  else {
    bVar1 = has_default(this);
    if (bVar1) {
      get_default_value<std::array<float,2ul>>(&local_6c,this);
      nonstd::optional_lite::optional<std::array<float,_2UL>_>::optional<std::array<float,_2UL>,_0>
                ((optional<std::array<float,_2UL>_> *)local_60,&local_6c);
      nonstd::optional_lite::optional<std::array<float,_2UL>_>::~optional(&local_6c);
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_60);
      if (bVar1) {
        pvVar2 = nonstd::optional_lite::optional<std::array<float,_2UL>_>::value
                           ((optional<std::array<float,_2UL>_> *)local_60);
        *(undefined8 *)v->_M_elems = *(undefined8 *)pvVar2->_M_elems;
        this_local._7_1_ = 1;
      }
      pv_1.contained._1_3_ = 0;
      pv_1.contained._0_1_ = bVar1;
      nonstd::optional_lite::optional<std::array<float,_2UL>_>::~optional
                ((optional<std::array<float,_2UL>_> *)local_60);
      if (pv_1.contained.data.__align != (anon_struct_4_0_00000001_for___align)0x0)
      goto LAB_002f6c68;
    }
    this_local._7_1_ = 0;
  }
LAB_002f6c68:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }